

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O0

void __thiscall Args::CmdLine::printInfoAboutUnknownArgument(CmdLine *this,String *word)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined8 uVar2;
  String names;
  StringList correctNames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  allocator *__rhs;
  String *in_stack_fffffffffffffe78;
  BaseException *in_stack_fffffffffffffe80;
  BaseException *this_00;
  allocator local_161;
  string local_160 [8];
  StringList *in_stack_fffffffffffffea8;
  StringList *in_stack_fffffffffffffee0;
  String *in_stack_fffffffffffffee8;
  CmdLine *in_stack_fffffffffffffef0;
  undefined1 local_f9 [249];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x145bf6);
  bVar1 = isMisspelledName(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                           in_stack_fffffffffffffee0);
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x30);
    __rhs = &local_161;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"Unknown argument \"",__rhs);
    std::operator+(in_stack_fffffffffffffe78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    std::operator+(in_stack_fffffffffffffe78,(char *)__rhs);
    BaseException::BaseException(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    __cxa_throw(uVar2,&BaseException::typeinfo,BaseException::~BaseException);
  }
  details::formatCorrectNamesString(in_stack_fffffffffffffea8);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x30);
  this_00 = (BaseException *)local_f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_f9 + 1),"Unknown argument \"",(allocator *)this_00);
  std::operator+(__lhs,in_stack_fffffffffffffe70);
  std::operator+(__lhs,(char *)in_stack_fffffffffffffe70);
  std::operator+(__lhs,in_stack_fffffffffffffe70);
  std::operator+(__lhs,(char *)in_stack_fffffffffffffe70);
  BaseException::BaseException(this_00,__lhs);
  __cxa_throw(__lhs,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

void printInfoAboutUnknownArgument( const String & word )
	{
		StringList correctNames;

		if( isMisspelledName( word, correctNames ) )
		{
			const String names = details::formatCorrectNamesString(
				correctNames );

			throw BaseException( String( SL( "Unknown argument \"" ) ) +
				word + SL( "\".\n\nProbably you mean \"" ) + names +
				SL( "\"." ) );
		}
		else
			throw BaseException( String( SL( "Unknown argument \"" ) ) +
				word + SL( "\"." ) );
	}